

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O0

ostream * __thiscall OpenMD::DumpWriter::createOStream(DumpWriter *this,string *filename)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *newOStream;
  code *this_00;
  string local_48 [48];
  ostream *local_18;
  
  poVar1 = (ostream *)operator_new(0x200);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(poVar1,pcVar2,_S_out);
  local_18 = poVar1;
  poVar1 = std::operator<<(poVar1,"<OpenMD version=2>");
  this_00 = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_18,"  <MetaData>");
  std::ostream::operator<<(poVar1,this_00);
  poVar1 = local_18;
  SimInfo::getRawMetaData_abi_cxx11_((SimInfo *)this_00);
  std::operator<<(poVar1,local_48);
  std::__cxx11::string::~string(local_48);
  poVar1 = std::operator<<(local_18,"  </MetaData>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return local_18;
}

Assistant:

std::ostream* DumpWriter::createOStream(const std::string& filename) {
    std::ostream* newOStream;
#ifdef HAVE_ZLIB
    if (needCompression_) {
      newOStream = new ogzstream(filename.c_str());
    } else {
      newOStream = new std::ofstream(filename.c_str());
    }
#else
    newOStream = new std::ofstream(filename.c_str());
#endif
    // write out MetaData first
    (*newOStream) << "<OpenMD version=2>" << std::endl;
    (*newOStream) << "  <MetaData>" << std::endl;
    (*newOStream) << info_->getRawMetaData();
    (*newOStream) << "  </MetaData>" << std::endl;
    return newOStream;
  }